

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void generate_skipper(CodeGeneratorData *codegen,int32_t skip_bytes,bool force_global_offset)

{
  bool bVar1;
  size_t sVar2;
  element_type *this;
  int32_t local_1c;
  int32_t target;
  bool force_global_offset_local;
  int32_t skip_bytes_local;
  CodeGeneratorData *codegen_local;
  
  sVar2 = BinaryWriter::current_offset(&codegen->bw);
  local_1c = skip_bytes + (int)sVar2 + (int)codegen->script_offset;
  if (!force_global_offset) {
    if (((codegen->program->opt).use_local_offsets & 1U) == 0) {
      this = std::__shared_ptr_access<const_Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&codegen->script);
      bVar1 = Script::uses_local_offsets(this);
      if (!bVar1) goto LAB_00282528;
    }
    local_1c = -local_1c;
  }
LAB_00282528:
  BinaryWriter::emplace_u16(&codegen->bw,2);
  BinaryWriter::emplace_u8(&codegen->bw,'\x01');
  BinaryWriter::emplace_i32(&codegen->bw,local_1c);
  return;
}

Assistant:

static void generate_skipper(CodeGeneratorData& codegen, int32_t skip_bytes, bool force_global_offset)//+8 +12
{
    int32_t target = skip_bytes + codegen.bw.current_offset() + codegen.script_offset;

    if(!force_global_offset)
    {
        if(codegen.program.opt.use_local_offsets || codegen.script->uses_local_offsets())
        {
            target = -target;
        }
    }

    codegen.bw.emplace_u16(0x0002);
    codegen.bw.emplace_u8(1);
    codegen.bw.emplace_i32(target);
}